

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

AltNode * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::AppendSurrogateRangeToDisjunction
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,codepoint_t minorCodePoint,
          codepoint_t majorCodePoint,AltNode *lastAltNode)

{
  undefined1 *puVar1;
  uint *puVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  undefined4 *puVar6;
  _func_int **pp_Var7;
  undefined8 *puVar8;
  Node *pNVar9;
  undefined8 *puVar10;
  AltNode *pAVar11;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar12;
  Node *pNVar13;
  AltNode *pAVar14;
  uint uVar15;
  codepoint_t codePointValue;
  uint uVar16;
  AltNode *pAVar17;
  uint uVar18;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *pPVar19;
  undefined1 auVar20 [16];
  Char local_7a;
  AltNode *pAStack_78;
  char16 lowerMajorBoundary;
  Node *local_70;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *local_68;
  char16 local_5a;
  uint local_58;
  codepoint_t cStack_54;
  char16 ignore;
  Char local_4e;
  uint local_4c;
  char cStack_48;
  char16 lowerMinorBoundary;
  undefined7 uStack_47;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *local_40;
  char16 local_38;
  char16 local_36;
  Char local_34;
  char16 local_32;
  char16 upperMinorCodeUnit;
  char16 lowerMajorCodeUnit;
  char16 upperMajorCodeUnit;
  char16 lowerMinorCodeUnit;
  
  local_58 = majorCodePoint - minorCodePoint;
  if (majorCodePoint < minorCodePoint || local_58 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x194,"(minorCodePoint < majorCodePoint)","minorCodePoint < majorCodePoint")
    ;
    if (!bVar4) goto LAB_00eb3394;
    *puVar6 = 0;
  }
  if (minorCodePoint < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x195,"(minorCodePoint >= 0x10000u)","minorCodePoint >= 0x10000u");
    if (!bVar4) goto LAB_00eb3394;
    *puVar6 = 0;
  }
  if (majorCodePoint < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x196,"(majorCodePoint >= 0x10000u)","majorCodePoint >= 0x10000u");
    if (!bVar4) goto LAB_00eb3394;
    *puVar6 = 0;
  }
  if ((((this->scriptContext->config).threadConfig)->m_ES6Unicode != true) ||
     (this->unicodeFlagPresent == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x197,
                       "(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent)"
                       ,
                       "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent"
                      );
    if (!bVar4) goto LAB_00eb3394;
    *puVar6 = 0;
  }
  local_40 = this;
  Js::NumberUtilities::CodePointAsSurrogatePair(minorCodePoint,&local_32,&local_38);
  _cStack_48 = (AltNode *)CONCAT44(uStack_47._3_4_,majorCodePoint);
  Js::NumberUtilities::CodePointAsSurrogatePair(majorCodePoint,&local_36,&local_34);
  uVar18 = (minorCodePoint & 0xfffffc00) + 0x400;
  cStack_54 = minorCodePoint;
  if (uVar18 < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a3,"(minorBoundary >= 0x10000)","minorBoundary >= 0x10000");
    if (!bVar4) goto LAB_00eb3394;
    *puVar6 = 0;
  }
  if (_cStack_48 < 0x10000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x1a4,"(majorBoundary >= 0x10000)","majorBoundary >= 0x10000");
    if (!bVar4) goto LAB_00eb3394;
    *puVar6 = 0;
  }
  pPVar19 = local_40;
  uVar15 = _cStack_48 & 0xfffffc00;
  pAStack_78 = lastAltNode;
  if (uVar15 < uVar18) {
    if (0x3ff < local_58) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1ae,"(majorCodePoint - minorCodePoint < 0x400u)",
                         "majorCodePoint - minorCodePoint < 0x400u");
      if (!bVar4) goto LAB_00eb3394;
      *puVar6 = 0;
    }
    if (local_32 != local_36) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1af,"(lowerMinorCodeUnit == lowerMajorCodeUnit)",
                         "lowerMinorCodeUnit == lowerMajorCodeUnit");
      if (!bVar4) goto LAB_00eb3394;
      *puVar6 = 0;
    }
    pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
    *(undefined4 *)(pp_Var7 + 1) = 5;
    *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
    *(undefined4 *)(pp_Var7 + 4) = 0;
    pp_Var7[2] = (_func_int *)0x0;
    pp_Var7[3] = (_func_int *)0x0;
    *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
    *pp_Var7 = (_func_int *)&PTR_LiteralLength_01542a10;
    *(undefined1 *)(pp_Var7 + 8) = 0;
    auVar20 = pshuflw(ZEXT216((ushort)local_32),ZEXT216((ushort)local_32),0);
    pp_Var7[7] = auVar20._0_8_;
    puVar8 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,pPVar19->ctAllocator,0x364470);
    *(undefined4 *)(puVar8 + 1) = 0xb;
    *(uint *)((long)puVar8 + 0xc) = *(uint *)((long)puVar8 + 0xc) & 0xffff8000;
    *(undefined1 (*) [16])(puVar8 + 2) = (undefined1  [16])0x0;
    *(undefined4 *)(puVar8 + 4) = 0;
    *(undefined8 *)((long)puVar8 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar8 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar8 + 0x34) = 0xffffffff;
    *puVar8 = &PTR_LiteralLength_01542af0;
    *(undefined2 *)(puVar8 + 7) = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar8 + 8));
    CharSet<char16_t>::SetRange
              ((CharSet<char16_t> *)(puVar8 + 8),pPVar19->ctAllocator,local_38,local_34);
    pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
    puVar10 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
    *(undefined4 *)(puVar10 + 1) = 6;
    *(uint *)((long)puVar10 + 0xc) = *(uint *)((long)puVar10 + 0xc) & 0xffff8000;
    puVar10[2] = 0;
    puVar10[3] = 0;
    *(undefined4 *)(puVar10 + 4) = 0;
    *(undefined8 *)((long)puVar10 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar10 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar10 + 0x34) = 0xffffffff;
    *puVar10 = &PTR_LiteralLength_01542bd0;
    puVar10[7] = puVar8;
    puVar10[8] = 0;
    pNVar9->tag = Concat;
    pNVar9->features = 0;
    *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
    pNVar9->firstSet = (CharSet<char16_t> *)0x0;
    pNVar9->followSet = (CharSet<char16_t> *)0x0;
    (pNVar9->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
    (pNVar9->followConsumes).upper = 0xffffffff;
    pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542bd0;
    pNVar9[1]._vptr_Node = pp_Var7;
    *(undefined8 **)&pNVar9[1].tag = puVar10;
    pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar19->ctAllocator,0x364470);
    (pAVar11->super_Node).tag = Alt;
    (pAVar11->super_Node).features = 0;
    puVar1 = &(pAVar11->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (pAVar11->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
    *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
    (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
    (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
    pAVar11->head = pNVar9;
    pAVar11->switchSize = 0;
    pAVar11->tail = (AltNode *)0x0;
    pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
    *(undefined8 *)((long)&pAVar11->runtimeTrie + 5) = 0;
    pAVar17 = pAStack_78;
  }
  else {
    if (uVar18 - cStack_54 == 1) {
      pNVar9 = CreateSurrogatePairAtom(local_40,local_32,local_38);
      local_4c = uVar18;
    }
    else if ((minorCodePoint & 0xfffffc00) == cStack_54) {
      local_4c = cStack_54;
      pNVar9 = (Node *)0x0;
    }
    else {
      if (0x3ff < uVar18 - cStack_54) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x1c5,"(minorBoundary - minorCodePoint < 0x400u)",
                           "minorBoundary - minorCodePoint < 0x400u");
        if (!bVar4) goto LAB_00eb3394;
        *puVar6 = 0;
      }
      pPVar19 = local_40;
      pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x48,local_40->ctAllocator,0x364470);
      *(undefined4 *)(pp_Var7 + 1) = 5;
      *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
      *(undefined4 *)(pp_Var7 + 4) = 0;
      pp_Var7[2] = (_func_int *)0x0;
      pp_Var7[3] = (_func_int *)0x0;
      *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
      *pp_Var7 = (_func_int *)&PTR_LiteralLength_01542a10;
      *(undefined1 *)(pp_Var7 + 8) = 0;
      auVar20 = pshuflw(ZEXT216((ushort)local_32),ZEXT216((ushort)local_32),0);
      pp_Var7[7] = auVar20._0_8_;
      puVar8 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,pPVar19->ctAllocator,0x364470);
      *(undefined4 *)(puVar8 + 1) = 0xb;
      *(uint *)((long)puVar8 + 0xc) = *(uint *)((long)puVar8 + 0xc) & 0xffff8000;
      *(undefined1 (*) [16])(puVar8 + 2) = (undefined1  [16])0x0;
      *(undefined4 *)(puVar8 + 4) = 0;
      *(undefined8 *)((long)puVar8 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar8 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar8 + 0x34) = 0xffffffff;
      *puVar8 = &PTR_LiteralLength_01542af0;
      *(undefined2 *)(puVar8 + 7) = 0x100;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar8 + 8));
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)(puVar8 + 8),local_40->ctAllocator,local_38,L'\xdfff');
      lastAltNode = (AltNode *)local_40;
      local_70 = (Node *)new<Memory::ArenaAllocator>(0x48,local_40->ctAllocator,0x364470);
      puVar10 = (undefined8 *)
                new<Memory::ArenaAllocator>
                          (0x48,((Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)lastAltNode)->
                                ctAllocator,0x364470);
      *(undefined4 *)(puVar10 + 1) = 6;
      *(uint *)((long)puVar10 + 0xc) = *(uint *)((long)puVar10 + 0xc) & 0xffff8000;
      puVar10[2] = 0;
      puVar10[3] = 0;
      *(undefined4 *)(puVar10 + 4) = 0;
      *(undefined8 *)((long)puVar10 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)puVar10 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)puVar10 + 0x34) = 0xffffffff;
      *puVar10 = &PTR_LiteralLength_01542bd0;
      puVar10[7] = puVar8;
      puVar10[8] = 0;
      local_70->tag = Concat;
      local_70->features = 0;
      *(uint *)&local_70->field_0xc = *(uint *)&local_70->field_0xc & 0xffff8000;
      local_70->firstSet = (CharSet<char16_t> *)0x0;
      local_70->followSet = (CharSet<char16_t> *)0x0;
      (local_70->prevConsumes).lower = 0;
      *(undefined8 *)&(local_70->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(local_70->thisConsumes).upper = 0xffffffff;
      (local_70->followConsumes).upper = 0xffffffff;
      local_70->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542bd0;
      local_70[1]._vptr_Node = pp_Var7;
      *(undefined8 **)&local_70[1].tag = puVar10;
      pNVar9 = local_70;
      local_4c = uVar18;
    }
    pPVar19 = local_40;
    uVar16 = _cStack_48;
    local_70 = pNVar9;
    if (uVar15 == _cStack_48) {
      pPVar12 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)
                CreateSurrogatePairAtom(local_40,local_36,local_34);
LAB_00eb2c4e:
      pPVar19 = local_40;
      pAVar17 = pAStack_78;
      codePointValue = uVar15 - 0x400;
      bVar4 = pNVar9 != (Node *)0x0;
      pAVar11 = (AltNode *)
                CONCAT71((int7)((ulong)lastAltNode >> 8),
                         pPVar12 != (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0);
      local_68 = pPVar12;
      if (((uVar18 == uVar15) && (pNVar9 != (Node *)0x0)) &&
         (pPVar12 != (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0)) {
        if (local_4c - 0x400 == cStack_54) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x1e4,"(minorCodePoint != minorBoundary - 0x400u)",
                             "minorCodePoint != minorBoundary - 0x400u");
          if (!bVar4) goto LAB_00eb3394;
          *puVar6 = 0;
        }
        if ((cStack_54 | 0x3ff) == _cStack_48) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x1e5,"(majorBoundary + 0x3FFu != majorCodePoint)",
                             "majorBoundary + 0x3FFu != majorCodePoint");
          if (!bVar4) goto LAB_00eb3394;
          *puVar6 = 0;
        }
        if (0x7ff < local_58) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x1e9,"(majorCodePoint - minorCodePoint < 0x800u)",
                             "majorCodePoint - minorCodePoint < 0x800u");
          if (!bVar4) goto LAB_00eb3394;
          *puVar6 = 0;
        }
        pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar19->ctAllocator,0x364470);
        pAVar14 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar19->ctAllocator,0x364470);
        (pAVar14->super_Node).tag = Alt;
        (pAVar14->super_Node).features = 0;
        puVar1 = &(pAVar14->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar14->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar14->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar14->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar14->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar14->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar14->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar14->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
        pAVar14->head = (Node *)local_68;
        pAVar14->switchSize = 0;
        pAVar14->tail = (AltNode *)0x0;
        pAVar14->runtimeTrie = (RuntimeCharTrie *)0x0;
        *(undefined8 *)((long)&pAVar14->runtimeTrie + 5) = 0;
        (pAVar11->super_Node).tag = Alt;
        (pAVar11->super_Node).features = 0;
        puVar1 = &(pAVar11->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar11->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
        pAVar11->head = local_70;
        pAVar11->tail = pAVar14;
        pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
        pAVar11->scheme = Try;
        pAVar11->isOptional = false;
        pAVar11->switchSize = 0;
        goto LAB_00eb3320;
      }
    }
    else {
      if ((_cStack_48 & 0x3ff) != 0x3ff) {
        pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x48,local_40->ctAllocator,0x364470);
        pNVar9->tag = MatchChar;
        pNVar9->features = 0;
        *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
        (pNVar9->prevConsumes).lower = 0;
        pNVar9->firstSet = (CharSet<char16_t> *)0x0;
        pNVar9->followSet = (CharSet<char16_t> *)0x0;
        *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
        (pNVar9->followConsumes).upper = 0xffffffff;
        pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
        *(undefined1 *)&pNVar9[1].tag = Empty;
        auVar20 = pshuflw(ZEXT216((ushort)local_36),ZEXT216((ushort)local_36),0);
        pNVar9[1]._vptr_Node = auVar20._0_8_;
        pNVar13 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar19->ctAllocator,0x364470);
        pNVar13->tag = MatchSet;
        pNVar13->features = 0;
        *(uint *)&pNVar13->field_0xc = *(uint *)&pNVar13->field_0xc & 0xffff8000;
        pNVar13->firstSet = (CharSet<char16_t> *)0x0;
        pNVar13->followSet = (CharSet<char16_t> *)0x0;
        (pNVar13->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar13->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar13->thisConsumes).upper = 0xffffffff;
        (pNVar13->followConsumes).upper = 0xffffffff;
        pNVar13->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
        *(undefined2 *)&pNVar13[1]._vptr_Node = 0x100;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar13[1].tag);
        pPVar19 = local_40;
        local_68 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)
                   CONCAT44(local_68._4_4_,uVar18);
        CharSet<char16_t>::SetRange
                  ((CharSet<char16_t> *)&pNVar13[1].tag,local_40->ctAllocator,L'\xdc00',local_34);
        pPVar12 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)
                  new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
        uVar18 = (uint)local_68;
        pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
        (pAVar11->super_Node).tag = Concat;
        (pAVar11->super_Node).features = 0;
        puVar1 = &(pAVar11->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pAVar11->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
        (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
        (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542bd0;
        pAVar11->head = pNVar13;
        pAVar11->tail = (AltNode *)0x0;
        *(undefined4 *)&pPVar12->ctAllocator = 6;
        puVar2 = (uint *)((long)&pPVar12->ctAllocator + 4);
        *puVar2 = *puVar2 & 0xffff8000;
        pPVar12->standardEncodedChars = (StandardChars<char16_t> *)0x0;
        pPVar12->standardChars = (StandardChars<char16_t> *)0x0;
        ((CountDomain *)&pPVar12->w)->lower = 0;
        *(undefined8 *)&((CountDomain *)&pPVar12->w)->upper = 0xffffffff;
        *(undefined8 *)&((CountDomain *)&pPVar12->input)->upper = 0xffffffff;
        ((CountDomain *)&pPVar12->inputLim)->upper = 0xffffffff;
        ((Node *)&pPVar12->scriptContext)->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542bd0;
        pPVar12->next = (EncodedChar *)pNVar9;
        *(AltNode **)&pPVar12->inBody = pAVar11;
        lastAltNode = (AltNode *)pPVar12;
        pNVar9 = local_70;
        uVar16 = _cStack_48;
        goto LAB_00eb2c4e;
      }
      bVar4 = pNVar9 != (Node *)0x0;
      pAVar11 = (AltNode *)0x0;
      local_68 = (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0;
      codePointValue = uVar15;
    }
    pPVar19 = local_40;
    if (local_58 < 0x400) {
      AssertCount = AssertCount + 1;
      _cStack_48 = pAVar11;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1ef,"(majorCodePoint - minorCodePoint >= 0x400u)",
                         "majorCodePoint - minorCodePoint >= 0x400u");
      if (!bVar5) goto LAB_00eb3394;
      *puVar6 = 0;
      pAVar11 = _cStack_48;
      pNVar9 = local_70;
    }
    _cStack_48 = (AltNode *)CONCAT71(uStack_47,bVar4);
    if (((((byte)pAVar11 & bVar4) == 0) && (pNVar9 != (Node *)0x0 || local_4c != cStack_54)) &&
       (local_68 != (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *)0x0 ||
        codePointValue + 0x3ff != uVar16)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x1f2,
                         "((prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint))"
                         ,
                         "(prefixNode != nullptr && suffixNode != nullptr) || (prefixNode == nullptr && minorBoundary == minorCodePoint) || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)"
                        );
      if (!bVar4) goto LAB_00eb3394;
      *puVar6 = 0;
    }
    uVar18 = local_4c;
    Js::NumberUtilities::CodePointAsSurrogatePair(local_4c,&local_4e,&local_5a);
    if (codePointValue == uVar18) {
      pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
      *(undefined4 *)(pp_Var7 + 1) = 5;
      *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
      pp_Var7[2] = (_func_int *)0x0;
      pp_Var7[3] = (_func_int *)0x0;
      *(undefined4 *)(pp_Var7 + 4) = 0;
      *(undefined8 *)((long)pp_Var7 + 0x24) = 0xffffffff;
      *(undefined8 *)((long)pp_Var7 + 0x2c) = 0xffffffff;
      *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
      *pp_Var7 = (_func_int *)&PTR_LiteralLength_01542a10;
      *(undefined1 *)(pp_Var7 + 8) = 0;
      auVar20 = pshuflw(ZEXT216((ushort)local_4e),ZEXT216((ushort)local_4e),0);
      pp_Var7[7] = auVar20._0_8_;
    }
    else {
      Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue,&local_7a,&local_5a);
      pp_Var7 = (_func_int **)new<Memory::ArenaAllocator>(0x68,pPVar19->ctAllocator,0x364470);
      *(undefined4 *)(pp_Var7 + 1) = 0xb;
      *(uint *)((long)pp_Var7 + 0xc) = *(uint *)((long)pp_Var7 + 0xc) & 0xffff8000;
      *(undefined1 (*) [16])(pp_Var7 + 2) = ZEXT816(0);
      *(undefined4 *)(pp_Var7 + 4) = 0;
      auVar20 = pmovsxbd(ZEXT816(0),0xff00ff);
      *(undefined1 (*) [16])((long)pp_Var7 + 0x24) = auVar20;
      *(undefined4 *)((long)pp_Var7 + 0x34) = 0xffffffff;
      *pp_Var7 = (_func_int *)&PTR_LiteralLength_01542af0;
      *(undefined2 *)(pp_Var7 + 7) = 0x100;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)(pp_Var7 + 8));
      pPVar19 = local_40;
      CharSet<char16_t>::SetRange
                ((CharSet<char16_t> *)(pp_Var7 + 8),local_40->ctAllocator,local_4e,local_7a);
    }
    puVar8 = (undefined8 *)new<Memory::ArenaAllocator>(0x68,pPVar19->ctAllocator,0x364470);
    *(undefined4 *)(puVar8 + 1) = 0xb;
    *(uint *)((long)puVar8 + 0xc) = *(uint *)((long)puVar8 + 0xc) & 0xffff8000;
    *(undefined1 (*) [16])(puVar8 + 2) = (undefined1  [16])0x0;
    *(undefined4 *)(puVar8 + 4) = 0;
    *(undefined8 *)((long)puVar8 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar8 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar8 + 0x34) = 0xffffffff;
    *puVar8 = &PTR_LiteralLength_01542af0;
    *(undefined2 *)(puVar8 + 7) = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)(puVar8 + 8));
    CharSet<char16_t>::SetRange
              ((CharSet<char16_t> *)(puVar8 + 8),pPVar19->ctAllocator,L'\xdc00',L'\xdfff');
    pAVar17 = (AltNode *)0x0;
    if ((byte)pAVar11 != 0) {
      pAVar17 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar19->ctAllocator,0x364470);
      (pAVar17->super_Node).tag = Alt;
      (pAVar17->super_Node).features = 0;
      puVar1 = &(pAVar17->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar17->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar17->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar17->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar17->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar17->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar17->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar17->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
      pAVar17->head = (Node *)local_68;
      pAVar17->switchSize = 0;
      pAVar17->tail = (AltNode *)0x0;
      pAVar17->runtimeTrie = (RuntimeCharTrie *)0x0;
      *(undefined8 *)((long)&pAVar17->runtimeTrie + 5) = 0;
    }
    if (cStack_48 != '\0') {
      pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar19->ctAllocator,0x364470);
      (pAVar11->super_Node).tag = Alt;
      (pAVar11->super_Node).features = 0;
      puVar1 = &(pAVar11->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar11->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
      pAVar11->head = local_70;
      pAVar11->tail = pAVar17;
      pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
      pAVar11->scheme = Try;
      pAVar11->isOptional = false;
      pAVar11->switchSize = 0;
      pAVar17 = pAVar11;
    }
    _cStack_48 = pAVar17;
    pAVar11 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar19->ctAllocator,0x364470);
    pNVar9 = (Node *)new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
    puVar10 = (undefined8 *)new<Memory::ArenaAllocator>(0x48,pPVar19->ctAllocator,0x364470);
    *(undefined4 *)(puVar10 + 1) = 6;
    *(uint *)((long)puVar10 + 0xc) = *(uint *)((long)puVar10 + 0xc) & 0xffff8000;
    puVar10[2] = 0;
    puVar10[3] = 0;
    *(undefined4 *)(puVar10 + 4) = 0;
    *(undefined8 *)((long)puVar10 + 0x24) = 0xffffffff;
    *(undefined8 *)((long)puVar10 + 0x2c) = 0xffffffff;
    *(undefined4 *)((long)puVar10 + 0x34) = 0xffffffff;
    *puVar10 = &PTR_LiteralLength_01542bd0;
    puVar10[7] = puVar8;
    puVar10[8] = 0;
    pNVar9->tag = Concat;
    pNVar9->features = 0;
    *(uint *)&pNVar9->field_0xc = *(uint *)&pNVar9->field_0xc & 0xffff8000;
    pNVar9->firstSet = (CharSet<char16_t> *)0x0;
    pNVar9->followSet = (CharSet<char16_t> *)0x0;
    (pNVar9->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar9->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar9->thisConsumes).upper = 0xffffffff;
    (pNVar9->followConsumes).upper = 0xffffffff;
    pNVar9->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542bd0;
    pNVar9[1]._vptr_Node = pp_Var7;
    *(undefined8 **)&pNVar9[1].tag = puVar10;
    (pAVar11->super_Node).tag = Alt;
    (pAVar11->super_Node).features = 0;
    puVar1 = &(pAVar11->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (pAVar11->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (pAVar11->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (pAVar11->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(pAVar11->super_Node).prevConsumes.upper = 0xffffffff;
    *(undefined8 *)&(pAVar11->super_Node).thisConsumes.upper = 0xffffffff;
    (pAVar11->super_Node).followConsumes.upper = 0xffffffff;
    (pAVar11->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
    pAVar11->head = pNVar9;
    pAVar11->tail = _cStack_48;
    pAVar11->runtimeTrie = (RuntimeCharTrie *)0x0;
    pAVar11->scheme = Try;
    pAVar11->isOptional = false;
    pAVar11->switchSize = 0;
    pAVar17 = pAStack_78;
  }
LAB_00eb3320:
  if (pAVar17 != (AltNode *)0x0) {
    if (pAVar17->tail != (AltNode *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x219,"(lastAltNode->tail == nullptr)","lastAltNode->tail == nullptr");
      if (!bVar4) {
LAB_00eb3394:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    pAVar17->tail = pAVar11;
  }
  return pAVar11;
}

Assistant:

AltNode* Parser<P, IsLiteral>::AppendSurrogateRangeToDisjunction(codepoint_t minorCodePoint, codepoint_t majorCodePoint, AltNode *lastAltNode)
    {
        Assert(minorCodePoint < majorCodePoint);
        Assert(minorCodePoint >= 0x10000u);
        Assert(majorCodePoint >= 0x10000u);
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() && unicodeFlagPresent);

        char16 lowerMinorCodeUnit, upperMinorCodeUnit, lowerMajorCodeUnit, upperMajorCodeUnit;
        Js::NumberUtilities::CodePointAsSurrogatePair(minorCodePoint, &lowerMinorCodeUnit, &upperMinorCodeUnit);
        Js::NumberUtilities::CodePointAsSurrogatePair(majorCodePoint, &lowerMajorCodeUnit, &upperMajorCodeUnit);

        // These boundaries represent whole range boundaries, as in 0x10000, 0x10400, 0x10800 etc
        // minor boundary is the first boundary strictly above minorCodePoint
        // major boundary is the first boundary below or equal to majorCodePoint
        codepoint_t minorBoundary = minorCodePoint - (minorCodePoint % 0x400u) + 0x400u;
        codepoint_t majorBoundary = majorCodePoint - (majorCodePoint % 0x400u);

        Assert(minorBoundary >= 0x10000);
        Assert(majorBoundary >= 0x10000);

        AltNode* tailToAdd = nullptr;

        // If the minor boundary is higher than major boundary, that means we have a range within the boundary and is less than 0x400
        // Ex: 0x10430 - 0x10700 will have minor boundary of 0x10800 and major of 0x10400
        // This pair will be represented in single range set.
        const bool singleRange = minorBoundary > majorBoundary;
        if (singleRange)
        {
            Assert(majorCodePoint - minorCodePoint < 0x400u);
            Assert(lowerMinorCodeUnit == lowerMajorCodeUnit);

            MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, lowerMinorCodeUnit);
            MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
            setNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)upperMajorCodeUnit);
            ConcatNode* concatNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, setNode, nullptr));

            tailToAdd = Anew(ctAllocator, AltNode, concatNode, nullptr);
        }
        else
        {
            Node* prefixNode = nullptr, *suffixNode = nullptr;
            const bool twoConsecutiveRanges = minorBoundary == majorBoundary;

            // For minorBoundary,
            if (minorBoundary - minorCodePoint == 1) // Single character in minor range
            {
                // The prefix is only a surrogate pair atom
                prefixNode = CreateSurrogatePairAtom(lowerMinorCodeUnit, upperMinorCodeUnit);
            }
            else if (minorCodePoint != minorBoundary - 0x400u) // Minor range isn't full
            {
                Assert(minorBoundary - minorCodePoint < 0x400u);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)upperMinorCodeUnit, (Char)0xDFFFu);
                prefixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
            }
            else // Full minor range
            {
                minorBoundary -= 0x400u;
            }

            if (majorBoundary == majorCodePoint) // Single character in major range
            {
                // The suffix is only a surrogate pair atom
                suffixNode = CreateSurrogatePairAtom(lowerMajorCodeUnit, upperMajorCodeUnit);
                majorBoundary -= 0x400u;
            }
            else if (majorBoundary + 0x3FFu != majorCodePoint) // Major range isn't full
            {
                Assert(majorCodePoint - majorBoundary < 0x3FFu);
                MatchCharNode* lowerCharNode = Anew(ctAllocator, MatchCharNode, (Char)lowerMajorCodeUnit);
                MatchSetNode* upperSetNode = Anew(ctAllocator, MatchSetNode, false, false);
                upperSetNode->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)upperMajorCodeUnit);
                suffixNode = Anew(ctAllocator, ConcatNode, lowerCharNode, Anew(ctAllocator, ConcatNode, upperSetNode, nullptr));
                majorBoundary -= 0x400u;
            }

            const bool nonFullConsecutiveRanges = twoConsecutiveRanges && prefixNode != nullptr && suffixNode != nullptr;
            if (nonFullConsecutiveRanges)
            {
                Assert(suffixNode != nullptr);
                Assert(minorCodePoint != minorBoundary - 0x400u);
                Assert(majorBoundary + 0x3FFu != majorCodePoint);

                // If the minor boundary is equal to major boundary, that means we have a cross boundary range that only needs 2 nodes for prefix/suffix.
                // We can only cross one boundary.
                Assert(majorCodePoint - minorCodePoint < 0x800u);
                tailToAdd = Anew(ctAllocator, AltNode, prefixNode, Anew(ctAllocator, AltNode, suffixNode, nullptr));
            }
            else
            {
                // We have 3 sets of ranges, comprising of prefix, full and suffix.
                Assert(majorCodePoint - minorCodePoint >= 0x400u);
                Assert((prefixNode != nullptr && suffixNode != nullptr) // Spanning more than two ranges
                    || (prefixNode == nullptr && minorBoundary == minorCodePoint) // Two consecutive ranges and the minor is full
                    || (suffixNode == nullptr && majorBoundary + 0x3FFu == majorCodePoint)); // Two consecutive ranges and the major is full

                Node* lowerOfFullRange;
                char16 lowerMinorBoundary, lowerMajorBoundary, ignore;
                Js::NumberUtilities::CodePointAsSurrogatePair(minorBoundary, &lowerMinorBoundary, &ignore);

                bool singleFullRange = majorBoundary == minorBoundary;
                if (singleFullRange)
                {
                    // The lower part of the full range is simple a surrogate lower char
                    lowerOfFullRange = Anew(ctAllocator, MatchCharNode, (Char)lowerMinorBoundary);
                }
                else
                {

                    Js::NumberUtilities::CodePointAsSurrogatePair(majorBoundary, &lowerMajorBoundary, &ignore);
                    MatchSetNode* setNode = Anew(ctAllocator, MatchSetNode, false, false);
                    setNode->set.SetRange(ctAllocator, (Char)lowerMinorBoundary, (Char)lowerMajorBoundary);
                    lowerOfFullRange = setNode;
                }
                MatchSetNode* fullUpperRange = Anew(ctAllocator, MatchSetNode, false, false);
                fullUpperRange->set.SetRange(ctAllocator, (Char)0xDC00u, (Char)0xDFFFu);

                // These are added in the following order [full] [prefix][suffix]
                // This is doing by prepending, so in reverse.
                if (suffixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, suffixNode, tailToAdd);
                }
                if (prefixNode != nullptr)
                {
                    tailToAdd = Anew(ctAllocator, AltNode, prefixNode, tailToAdd);
                }
                tailToAdd = Anew(ctAllocator, AltNode, Anew(ctAllocator, ConcatNode, lowerOfFullRange, Anew(ctAllocator, ConcatNode, fullUpperRange, nullptr)), tailToAdd);
            }
        }

        if (lastAltNode != nullptr)
        {
            Assert(lastAltNode->tail == nullptr);
            lastAltNode->tail = tailToAdd;
        }

        return tailToAdd;
    }